

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmi2mid.cc
# Opt level: O1

PBuffer __thiscall ConvertorXMI2MID::create_track(ConvertorXMI2MID *this,MidiNodes *nodes)

{
  byte value;
  uchar value_00;
  uchar value_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  MutableBuffer *this_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_03;
  ulong uVar1;
  long lVar2;
  uint uVar3;
  long *in_RDX;
  int iVar4;
  long lVar5;
  __normal_iterator<ConvertorXMI2MID::MidiNode_*,_std::vector<ConvertorXMI2MID::MidiNode,_std::allocator<ConvertorXMI2MID::MidiNode>_>_>
  __i;
  long lVar6;
  bool bVar7;
  PBuffer PVar8;
  PMutableBuffer data;
  undefined1 local_79;
  MutableBuffer *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  long *local_68;
  long local_60;
  PBuffer local_58;
  ConvertorXMI2MID *local_48;
  element_type *local_40;
  EndianessMode local_34;
  
  lVar2 = *in_RDX;
  lVar5 = in_RDX[1];
  local_68 = in_RDX;
  local_48 = this;
  if (lVar2 != lVar5) {
    uVar1 = lVar5 - lVar2 >> 5;
    lVar6 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<ConvertorXMI2MID::MidiNode*,std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<ConvertorXMI2MID::create_track(std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>*)::CompareByTime>>
              (lVar2,lVar5,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar5 - lVar2 < 0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<ConvertorXMI2MID::MidiNode*,std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>>,__gnu_cxx::__ops::_Iter_comp_iter<ConvertorXMI2MID::create_track(std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>*)::CompareByTime>>
                (lVar2,lVar5);
    }
    else {
      lVar6 = lVar2 + 0x200;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<ConvertorXMI2MID::MidiNode*,std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>>,__gnu_cxx::__ops::_Iter_comp_iter<ConvertorXMI2MID::create_track(std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>*)::CompareByTime>>
                (lVar2,lVar6);
      for (; lVar6 != lVar5; lVar6 = lVar6 + 0x20) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<ConvertorXMI2MID::MidiNode*,std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>>,__gnu_cxx::__ops::_Val_comp_iter<ConvertorXMI2MID::create_track(std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>*)::CompareByTime>>
                  (lVar6);
      }
    }
  }
  local_34 = EndianessBig;
  local_78 = (MutableBuffer *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MutableBuffer,std::allocator<MutableBuffer>,Buffer::EndianessMode>
            (&local_70,&local_78,(allocator<MutableBuffer> *)&local_79,&local_34);
  std::__shared_ptr<MutableBuffer,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<MutableBuffer,MutableBuffer>
            ((__shared_ptr<MutableBuffer,(__gnu_cxx::_Lock_policy)2> *)&local_78,local_78);
  lVar2 = local_68[1];
  if (*local_68 != lVar2) {
    lVar5 = 0;
    do {
      local_60 = *(long *)(lVar2 + -0x20);
      value = *(byte *)(lVar2 + -0x14);
      value_00 = *(uchar *)(lVar2 + -0x13);
      value_01 = *(uchar *)(lVar2 + -0x12);
      local_40 = *(element_type **)(lVar2 + -0x10);
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar2 + -8);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      lVar2 = local_68[1];
      local_68[1] = lVar2 + -0x20;
      this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar2 + -8);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      this_03._M_pi = local_70._M_pi;
      this_02 = local_78;
      if ((element_type *)local_70._M_pi != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((enable_shared_from_this<Buffer> *)&(local_70._M_pi)->_M_use_count)->
                   _M_weak_this).super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(((enable_shared_from_this<Buffer> *)&(local_70._M_pi)->_M_use_count)->
                        _M_weak_this).super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
               1;
          UNLOCK();
        }
        else {
          *(int *)&(((enable_shared_from_this<Buffer> *)&(local_70._M_pi)->_M_use_count)->
                   _M_weak_this).super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(((enable_shared_from_this<Buffer> *)&(local_70._M_pi)->_M_use_count)->
                        _M_weak_this).super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
               1;
        }
      }
      uVar1 = local_60 - lVar5;
      uVar3 = (uint)uVar1 & 0x7f;
      iVar4 = 1;
      if (0x7f < uVar1) {
        do {
          uVar3 = (uint)(uVar1 >> 7) & 0xff | uVar3 << 8 | 0x80;
          iVar4 = iVar4 + 1;
          bVar7 = 0x3fff < uVar1;
          uVar1 = uVar1 >> 7;
        } while (bVar7);
      }
      do {
        MutableBuffer::push<unsigned_char>(this_02,(uchar)uVar3,1);
        uVar3 = uVar3 >> 8;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      if ((element_type *)this_03._M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03._M_pi);
      }
      MutableBuffer::push<unsigned_char>(local_78,value,1);
      MutableBuffer::push<unsigned_char>(local_78,value_00,1);
      if (((value & 0xf0 | 0x10) != 0xd0) &&
         (MutableBuffer::push<unsigned_char>(local_78,value_01,1), value_01 != '\0' && value == 0xff
         )) {
        local_58.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_40;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        local_58.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
        MutableBuffer::push(local_78,&local_58);
        if (local_58.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_58.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      lVar2 = local_68[1];
      lVar5 = local_60;
    } while (*local_68 != lVar2);
  }
  (local_48->super_Convertor)._vptr_Convertor = (_func_int **)local_78;
  (local_48->super_Convertor).buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (local_48->super_Convertor).buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_70._M_pi;
  PVar8.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  PVar8.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_48;
  return (PBuffer)PVar8.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PBuffer
ConvertorXMI2MID::create_track(MidiNodes *nodes) {
  class CompareByTime {
   public:
    // Return true if first midi node should come before second.
    bool operator()(const MidiNode &m1, const MidiNode &m2) const {
      if (m1.time != m2.time) {
        return m1.time > m2.time;
      }
      return false;
    }
  };

  // Sort the nodes.
  std::sort(nodes->begin(), nodes->end(), CompareByTime());

  PMutableBuffer data = std::make_shared<MutableBuffer>(Buffer::EndianessBig);
  uint64_t time = 0;
  while (!nodes->empty()) {
    MidiNode node = nodes->back();
    nodes->pop_back();

    midi_write_variable_size(node.time - time, data);
    time = node.time;
    data->push<uint8_t>(node.type);
    data->push<uint8_t>(node.data1);
    if (((node.type & 0xF0) != 0xC0) && ((node.type & 0xF0) != 0xD0)) {
      data->push<uint8_t>(node.data2);
      if (node.type == 0xFF) {
        if (node.data2 > 0) {
          data->push(node.buffer);
        }
      }
    }
  }

  return data;
}